

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_color_stats_add(LodePNGColorStats *stats,uint r,uint g,uint b,uint a)

{
  uint uVar1;
  undefined1 local_58 [8];
  LodePNGColorMode mode;
  uchar image [8];
  uint error;
  uint a_local;
  uint b_local;
  uint g_local;
  uint r_local;
  LodePNGColorStats *stats_local;
  
  lodepng_color_mode_init((LodePNGColorMode *)local_58);
  mode.key_b._0_1_ = (undefined1)(r >> 8);
  mode.key_b._1_1_ = (undefined1)r;
  mode.key_b._2_1_ = (undefined1)(g >> 8);
  mode.key_b._3_1_ = (undefined1)g;
  local_58._4_4_ = 0x10;
  local_58._0_4_ = LCT_RGBA;
  uVar1 = lodepng_compute_color_stats(stats,(uchar *)&mode.key_b,1,1,(LodePNGColorMode *)local_58);
  lodepng_color_mode_cleanup((LodePNGColorMode *)local_58);
  return uVar1;
}

Assistant:

static unsigned lodepng_color_stats_add(LodePNGColorStats* stats,
                                        unsigned r, unsigned g, unsigned b, unsigned a) {
  unsigned error = 0;
  unsigned char image[8];
  LodePNGColorMode mode;
  lodepng_color_mode_init(&mode);
  image[0] = r >> 8; image[1] = r; image[2] = g >> 8; image[3] = g;
  image[4] = b >> 8; image[5] = b; image[6] = a >> 8; image[7] = a;
  mode.bitdepth = 16;
  mode.colortype = LCT_RGBA;
  error = lodepng_compute_color_stats(stats, image, 1, 1, &mode);
  lodepng_color_mode_cleanup(&mode);
  return error;
}